

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

void TestLowLevelAPI(EVP_CIPHER *cipher,Operation op,bool in_place,size_t chunk_size,
                    Span<const_unsigned_char> key,Span<const_unsigned_char> iv,
                    Span<const_unsigned_char> plaintext,Span<const_unsigned_char> ciphertext)

{
  Span<const_unsigned_char> span;
  Span<const_unsigned_char> span_00;
  bool bVar1;
  char *pcVar2;
  uchar *puVar3;
  size_t sVar4;
  iterator __first;
  iterator __last;
  uchar *puVar5;
  unsigned_long *puVar6;
  bool bVar7;
  Span<const_unsigned_char> SVar8;
  Span<unsigned_char> SVar9;
  bool local_483;
  bool local_482;
  bool local_481;
  Span<const_unsigned_char> *local_480;
  Span<const_unsigned_char> *local_478;
  AssertHelper local_458;
  Message local_450;
  Span<const_unsigned_char> local_448;
  Bytes local_438;
  uchar *local_428;
  uchar *puStack_420;
  Bytes local_410;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_7;
  size_t local_3d0;
  size_t local_3c8;
  size_t todo_2;
  int num_1;
  Message local_3b0;
  Span<const_unsigned_char> local_3a8;
  Bytes local_398;
  uchar *local_388;
  uchar *puStack_380;
  Bytes local_378;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_6;
  size_t local_338;
  size_t local_330;
  size_t todo_1;
  Message local_320;
  Span<const_unsigned_char> local_318;
  Bytes local_308;
  uchar *local_2f8;
  uchar *puStack_2f0;
  Bytes local_2e8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_5;
  size_t local_2a8;
  size_t local_2a0;
  size_t todo;
  uint8_t ecount_buf [16];
  uint local_27c;
  uchar local_278 [4];
  uint num;
  uint8_t ivec [16];
  Message local_260;
  unsigned_long local_258;
  size_t local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_4;
  Message local_230;
  size_t local_228;
  size_t local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_3;
  Span<unsigned_char> out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  Message local_1d8;
  int local_1d0;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_2;
  Message local_1b0;
  int local_1a8;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  AES_KEY aes;
  Message local_90 [3];
  Operation local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 uStack_58;
  bool is_ofb;
  bool is_cbc;
  bool is_ctr;
  int nid;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> in;
  size_t sStack_30;
  bool encrypt;
  size_t chunk_size_local;
  bool in_place_local;
  EVP_CIPHER *pEStack_20;
  Operation op_local;
  EVP_CIPHER *cipher_local;
  Span<const_unsigned_char> key_local;
  
  key_local.data_ = (uchar *)key.size_;
  cipher_local = (EVP_CIPHER *)key.data_;
  local_480 = &plaintext;
  bVar7 = op == kEncrypt;
  local_478 = &ciphertext;
  if (bVar7) {
    local_478 = local_480;
  }
  expected.size_ = (size_t)local_478->data_;
  if (bVar7) {
    local_480 = &ciphertext;
  }
  _uStack_58 = local_480->data_;
  expected.data_ = (uchar *)local_480->size_;
  sStack_30 = chunk_size;
  chunk_size_local._3_1_ = in_place;
  chunk_size_local._4_4_ = op;
  pEStack_20 = cipher;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = EVP_CIPHER_nid((EVP_CIPHER *)cipher);
  local_481 = true;
  if ((gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ != 0x388) &&
     (local_481 = true,
     gtest_ar.message_._M_t.
     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
     ._M_head_impl._4_4_ != 0x389)) {
    local_481 = gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0x38a;
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_1_ = local_481;
  local_482 = true;
  if ((gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ != 0x1a3) &&
     (local_482 = true,
     gtest_ar.message_._M_t.
     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
     ._M_head_impl._4_4_ != 0x1a7)) {
    local_482 = gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0x1ab;
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._2_1_ = local_482;
  local_483 = true;
  if ((gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ != 0x1a4) &&
     (local_483 = true,
     gtest_ar.message_._M_t.
     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
     ._M_head_impl._4_4_ != 0x1a8)) {
    local_483 = gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0x1ac;
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._1_1_ = local_483;
  if (((local_481 != false) || (local_482 != false)) || (local_483 != false)) {
    local_74 = kInvalidDecrypt;
    testing::internal::CmpHelperNE<Operation,Operation>
              ((internal *)local_70,"op","Operation::kInvalidDecrypt",
               (Operation *)((long)&chunk_size_local + 4),&local_74);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&aes.rounds,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x134,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&aes.rounds,local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&aes.rounds);
      testing::Message::~Message(local_90);
    }
    aes.rd_key[0x3b] = (uint32_t)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (aes.rd_key[0x3b] == 0) {
      if ((bVar7) ||
         ((gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._2_1_ & 1) == 0)) {
        local_1a4 = 0;
        puVar3 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&cipher_local);
        sVar4 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&cipher_local);
        local_1a8 = AES_set_encrypt_key(puVar3,(int)sVar4 << 3,(AES_KEY *)&gtest_ar_1.message_);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1a0,"0","AES_set_encrypt_key(key.data(), key.size() * 8, &aes)"
                   ,&local_1a4,&local_1a8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
        if (!bVar1) {
          testing::Message::Message(&local_1b0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x138,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_1b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_1b0);
        }
        aes.rd_key[0x3b] = (uint32_t)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
      }
      else {
        local_1cc = 0;
        puVar3 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&cipher_local);
        sVar4 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&cipher_local);
        local_1d0 = AES_set_decrypt_key(puVar3,(int)sVar4 << 3,(AES_KEY *)&gtest_ar_1.message_);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_1c8,"0","AES_set_decrypt_key(key.data(), key.size() * 8, &aes)"
                   ,&local_1cc,&local_1d0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
        if (!bVar1) {
          testing::Message::Message(&local_1d8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x13a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d8);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_1d8);
        }
        aes.rd_key[0x3b] = (uint32_t)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
      }
      if (aes.rd_key[0x3b] == 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out.size_);
        if ((chunk_size_local._3_1_ & 1) == 0) {
          sVar4 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&uStack_58);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out.size_,sVar4);
        }
        else {
          __first = bssl::Span<const_unsigned_char>::begin
                              ((Span<const_unsigned_char> *)&expected.size_);
          __last = bssl::Span<const_unsigned_char>::end
                             ((Span<const_unsigned_char> *)&expected.size_);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          assign<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&out.size_,__first,
                     __last);
        }
        bssl::Span<unsigned_char>::
        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<unsigned_char> *)&gtest_ar_3.message_,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out.size_);
        local_220 = bssl::Span<const_unsigned_char>::size
                              ((Span<const_unsigned_char> *)&expected.size_);
        local_228 = bssl::Span<unsigned_char>::size((Span<unsigned_char> *)&gtest_ar_3.message_);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_218,"in.size()","out.size()",&local_220,&local_228);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
        if (!bVar1) {
          testing::Message::Message(&local_230);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x145,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_230);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_230);
        }
        aes.rd_key[0x3b] = (uint32_t)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
        if (aes.rd_key[0x3b] == 0) {
          local_250 = bssl::Span<const_unsigned_char>::size(&iv);
          local_258 = 0x10;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_248,"iv.size()","size_t{16}",&local_250,&local_258);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
          if (!bVar1) {
            testing::Message::Message(&local_260);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)(ivec + 8),kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x148,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)(ivec + 8),&local_260);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(ivec + 8));
            testing::Message::~Message(&local_260);
          }
          aes.rd_key[0x3b] = (uint32_t)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
          if (aes.rd_key[0x3b] == 0) {
            puVar3 = bssl::Span<const_unsigned_char>::data(&iv);
            sVar4 = bssl::Span<const_unsigned_char>::size(&iv);
            OPENSSL_memcpy(local_278,puVar3,sVar4);
            if ((gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._3_1_ & 1) == 0) {
              if (((gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._2_1_ & 1) == 0) || ((sStack_30 & 0xf) != 0)) {
                if ((gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._1_1_ & 1) != 0) {
                  todo_2._4_4_ = 0;
                  if (sStack_30 == 0) {
                    puVar3 = bssl::Span<const_unsigned_char>::data
                                       ((Span<const_unsigned_char> *)&expected.size_);
                    puVar5 = bssl::Span<unsigned_char>::data
                                       ((Span<unsigned_char> *)&gtest_ar_3.message_);
                    sVar4 = bssl::Span<const_unsigned_char>::size
                                      ((Span<const_unsigned_char> *)&expected.size_);
                    AES_ofb128_encrypt(puVar3,puVar5,sVar4,(AES_KEY *)&gtest_ar_1.message_,local_278
                                       ,(int *)((long)&todo_2 + 4));
                  }
                  else {
                    do {
                      local_3d0 = bssl::Span<const_unsigned_char>::size
                                            ((Span<const_unsigned_char> *)&expected.size_);
                      puVar6 = std::min<unsigned_long>(&local_3d0,&stack0xffffffffffffffd0);
                      local_3c8 = *puVar6;
                      puVar3 = bssl::Span<const_unsigned_char>::data
                                         ((Span<const_unsigned_char> *)&expected.size_);
                      puVar5 = bssl::Span<unsigned_char>::data
                                         ((Span<unsigned_char> *)&gtest_ar_3.message_);
                      AES_ofb128_encrypt(puVar3,puVar5,local_3c8,(AES_KEY *)&gtest_ar_1.message_,
                                         local_278,(int *)((long)&todo_2 + 4));
                      SVar8 = bssl::Span<const_unsigned_char>::subspan
                                        ((Span<const_unsigned_char> *)&expected.size_,local_3c8,
                                         0xffffffffffffffff);
                      expected.size_ = (size_t)SVar8.data_;
                      SVar9 = bssl::Span<unsigned_char>::subspan
                                        ((Span<unsigned_char> *)&gtest_ar_3.message_,local_3c8,
                                         0xffffffffffffffff);
                      out.data_ = (uchar *)SVar9.size_;
                      gtest_ar_7.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )SVar9.data_;
                      gtest_ar_3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           gtest_ar_7.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
                      bVar7 = bssl::Span<const_unsigned_char>::empty
                                        ((Span<const_unsigned_char> *)&expected.size_);
                    } while (((bVar7 ^ 0xffU) & 1) != 0);
                  }
                  local_428 = _uStack_58;
                  puStack_420 = expected.data_;
                  SVar8.size_ = (size_t)expected.data_;
                  SVar8.data_ = _uStack_58;
                  Bytes::Bytes(&local_410,SVar8);
                  bssl::Span<unsigned_char_const>::
                  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((Span<unsigned_char_const> *)&local_448,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out.size_);
                  Bytes::Bytes(&local_438,local_448);
                  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                            ((EqHelper *)local_400,"Bytes(expected)","Bytes(result)",&local_410,
                             &local_438);
                  bVar7 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_400);
                  if (!bVar7) {
                    testing::Message::Message(&local_450);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_458,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                               ,0x175,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_458,&local_450);
                    testing::internal::AssertHelper::~AssertHelper(&local_458);
                    testing::Message::~Message(&local_450);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
                }
              }
              else {
                if (sStack_30 == 0) {
                  puVar3 = bssl::Span<const_unsigned_char>::data
                                     ((Span<const_unsigned_char> *)&expected.size_);
                  puVar5 = bssl::Span<unsigned_char>::data
                                     ((Span<unsigned_char> *)&gtest_ar_3.message_);
                  sVar4 = bssl::Span<const_unsigned_char>::size
                                    ((Span<const_unsigned_char> *)&expected.size_);
                  AES_cbc_encrypt(puVar3,puVar5,sVar4,(AES_KEY *)&gtest_ar_1.message_,local_278,
                                  (uint)bVar7);
                }
                else {
                  do {
                    local_338 = bssl::Span<const_unsigned_char>::size
                                          ((Span<const_unsigned_char> *)&expected.size_);
                    puVar6 = std::min<unsigned_long>(&local_338,&stack0xffffffffffffffd0);
                    local_330 = *puVar6;
                    puVar3 = bssl::Span<const_unsigned_char>::data
                                       ((Span<const_unsigned_char> *)&expected.size_);
                    puVar5 = bssl::Span<unsigned_char>::data
                                       ((Span<unsigned_char> *)&gtest_ar_3.message_);
                    AES_cbc_encrypt(puVar3,puVar5,local_330,(AES_KEY *)&gtest_ar_1.message_,
                                    local_278,(uint)bVar7);
                    SVar8 = bssl::Span<const_unsigned_char>::subspan
                                      ((Span<const_unsigned_char> *)&expected.size_,local_330,
                                       0xffffffffffffffff);
                    expected.size_ = (size_t)SVar8.data_;
                    SVar9 = bssl::Span<unsigned_char>::subspan
                                      ((Span<unsigned_char> *)&gtest_ar_3.message_,local_330,
                                       0xffffffffffffffff);
                    out.data_ = (uchar *)SVar9.size_;
                    gtest_ar_6.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )SVar9.data_;
                    gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
                    bVar1 = bssl::Span<const_unsigned_char>::empty
                                      ((Span<const_unsigned_char> *)&expected.size_);
                  } while (((bVar1 ^ 0xffU) & 1) != 0);
                }
                local_388 = _uStack_58;
                puStack_380 = expected.data_;
                span.size_ = (size_t)expected.data_;
                span.data_ = _uStack_58;
                Bytes::Bytes(&local_378,span);
                bssl::Span<unsigned_char_const>::
                Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((Span<unsigned_char_const> *)&local_3a8,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out.size_);
                Bytes::Bytes(&local_398,local_3a8);
                testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                          ((EqHelper *)local_368,"Bytes(expected)","Bytes(result)",&local_378,
                           &local_398);
                bVar7 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_368);
                if (!bVar7) {
                  testing::Message::Message(&local_3b0);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffffc48,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x168,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xfffffffffffffc48,&local_3b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffffc48);
                  testing::Message::~Message(&local_3b0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
              }
            }
            else {
              local_27c = 0;
              if (sStack_30 == 0) {
                puVar3 = bssl::Span<const_unsigned_char>::data
                                   ((Span<const_unsigned_char> *)&expected.size_);
                puVar5 = bssl::Span<unsigned_char>::data
                                   ((Span<unsigned_char> *)&gtest_ar_3.message_);
                sVar4 = bssl::Span<const_unsigned_char>::size
                                  ((Span<const_unsigned_char> *)&expected.size_);
                AES_ctr128_encrypt(puVar3,puVar5,sVar4,(AES_KEY *)&gtest_ar_1.message_,local_278,
                                   (uchar *)&todo,&local_27c);
              }
              else {
                do {
                  local_2a8 = bssl::Span<const_unsigned_char>::size
                                        ((Span<const_unsigned_char> *)&expected.size_);
                  puVar6 = std::min<unsigned_long>(&local_2a8,&stack0xffffffffffffffd0);
                  local_2a0 = *puVar6;
                  puVar3 = bssl::Span<const_unsigned_char>::data
                                     ((Span<const_unsigned_char> *)&expected.size_);
                  puVar5 = bssl::Span<unsigned_char>::data
                                     ((Span<unsigned_char> *)&gtest_ar_3.message_);
                  AES_ctr128_encrypt(puVar3,puVar5,local_2a0,(AES_KEY *)&gtest_ar_1.message_,
                                     local_278,(uchar *)&todo,&local_27c);
                  SVar8 = bssl::Span<const_unsigned_char>::subspan
                                    ((Span<const_unsigned_char> *)&expected.size_,local_2a0,
                                     0xffffffffffffffff);
                  expected.size_ = (size_t)SVar8.data_;
                  SVar9 = bssl::Span<unsigned_char>::subspan
                                    ((Span<unsigned_char> *)&gtest_ar_3.message_,local_2a0,
                                     0xffffffffffffffff);
                  out.data_ = (uchar *)SVar9.size_;
                  gtest_ar_5.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )SVar9.data_;
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       gtest_ar_5.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
                  bVar7 = bssl::Span<const_unsigned_char>::empty
                                    ((Span<const_unsigned_char> *)&expected.size_);
                } while (((bVar7 ^ 0xffU) & 1) != 0);
              }
              local_2f8 = _uStack_58;
              puStack_2f0 = expected.data_;
              span_00.size_ = (size_t)expected.data_;
              span_00.data_ = _uStack_58;
              Bytes::Bytes(&local_2e8,span_00);
              bssl::Span<unsigned_char_const>::
              Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((Span<unsigned_char_const> *)&local_318,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out.size_);
              Bytes::Bytes(&local_308,local_318);
              testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                        ((EqHelper *)local_2d8,"Bytes(expected)","Bytes(result)",&local_2e8,
                         &local_308);
              bVar7 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
              if (!bVar7) {
                testing::Message::Message(&local_320);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&todo_1,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0x15b,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&todo_1,&local_320);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&todo_1);
                testing::Message::~Message(&local_320);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
            }
            aes.rd_key[0x3b] = 0;
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out.size_);
      }
    }
  }
  return;
}

Assistant:

static void TestLowLevelAPI(
    const EVP_CIPHER *cipher, Operation op, bool in_place, size_t chunk_size,
    bssl::Span<const uint8_t> key, bssl::Span<const uint8_t> iv,
    bssl::Span<const uint8_t> plaintext, bssl::Span<const uint8_t> ciphertext) {
  bool encrypt = op == Operation::kEncrypt;
  bssl::Span<const uint8_t> in = encrypt ? plaintext : ciphertext;
  bssl::Span<const uint8_t> expected = encrypt ? ciphertext : plaintext;
  int nid = EVP_CIPHER_nid(cipher);
  bool is_ctr = nid == NID_aes_128_ctr || nid == NID_aes_192_ctr ||
                nid == NID_aes_256_ctr;
  bool is_cbc = nid == NID_aes_128_cbc || nid == NID_aes_192_cbc ||
                nid == NID_aes_256_cbc;
  bool is_ofb = nid == NID_aes_128_ofb128 || nid == NID_aes_192_ofb128 ||
                nid == NID_aes_256_ofb128;
  if (!is_ctr && !is_cbc && !is_ofb) {
    return;
  }

  // Invalid ciphertexts are not possible in any of the ciphers where this API
  // applies.
  ASSERT_NE(op, Operation::kInvalidDecrypt);

  AES_KEY aes;
  if (encrypt || !is_cbc) {
    ASSERT_EQ(0, AES_set_encrypt_key(key.data(), key.size() * 8, &aes));
  } else {
    ASSERT_EQ(0, AES_set_decrypt_key(key.data(), key.size() * 8, &aes));
  }

  std::vector<uint8_t> result;
  if (in_place) {
    result.assign(in.begin(), in.end());
  } else {
    result.resize(expected.size());
  }
  bssl::Span<uint8_t> out = bssl::Span(result);
  // Input and output sizes for all the low-level APIs should match.
  ASSERT_EQ(in.size(), out.size());

  // The low-level APIs all use block-size IVs.
  ASSERT_EQ(iv.size(), size_t{AES_BLOCK_SIZE});
  uint8_t ivec[AES_BLOCK_SIZE];
  OPENSSL_memcpy(ivec, iv.data(), iv.size());

  if (is_ctr) {
    unsigned num = 0;
    uint8_t ecount_buf[AES_BLOCK_SIZE];
    if (chunk_size == 0) {
      AES_ctr128_encrypt(in.data(), out.data(), in.size(), &aes, ivec,
                         ecount_buf, &num);
    } else {
      do {
        size_t todo = std::min(in.size(), chunk_size);
        AES_ctr128_encrypt(in.data(), out.data(), todo, &aes, ivec, ecount_buf,
                           &num);
        in = in.subspan(todo);
        out = out.subspan(todo);
      } while (!in.empty());
    }
    EXPECT_EQ(Bytes(expected), Bytes(result));
  } else if (is_cbc && chunk_size % AES_BLOCK_SIZE == 0) {
    // Note |AES_cbc_encrypt| requires block-aligned chunks.
    if (chunk_size == 0) {
      AES_cbc_encrypt(in.data(), out.data(), in.size(), &aes, ivec, encrypt);
    } else {
      do {
        size_t todo = std::min(in.size(), chunk_size);
        AES_cbc_encrypt(in.data(), out.data(), todo, &aes, ivec, encrypt);
        in = in.subspan(todo);
        out = out.subspan(todo);
      } while (!in.empty());
    }
    EXPECT_EQ(Bytes(expected), Bytes(result));
  } else if (is_ofb) {
    int num = 0;
    if (chunk_size == 0) {
      AES_ofb128_encrypt(in.data(), out.data(), in.size(), &aes, ivec, &num);
    } else {
      do {
        size_t todo = std::min(in.size(), chunk_size);
        AES_ofb128_encrypt(in.data(), out.data(), todo, &aes, ivec, &num);
        in = in.subspan(todo);
        out = out.subspan(todo);
      } while (!in.empty());
    }
    EXPECT_EQ(Bytes(expected), Bytes(result));
  }
}